

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

Point2f pbrt::InvertSphericalRectangleSample
                  (Point3f *pRef,Point3f *s,Vector3f *ex,Vector3f *ey,Point3f *pRect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar23;
  float fVar24;
  float fVar55;
  float fVar58;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar59;
  undefined1 auVar36 [16];
  float fVar25;
  float fVar26;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar27;
  undefined1 auVar39 [16];
  float fVar56;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar28;
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  Tuple2<pbrt::Point2,_float> TVar29;
  float fVar57;
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar43 [16];
  undefined1 auVar54 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  float local_c8;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  undefined1 extraout_var_08 [60];
  
  fVar23 = (ex->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar1 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar3 = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar16._0_4_ = (float)uVar1 * (float)uVar1;
  auVar16._4_4_ = (float)uVar3 * (float)uVar3;
  auVar16._8_8_ = 0;
  auVar20 = vmovshdup_avx(auVar16);
  fVar23 = fVar23 * fVar23 + auVar16._0_4_ + auVar20._0_4_;
  if (fVar23 < 0.0) {
    auVar45._0_4_ = sqrtf(fVar23);
    auVar45._4_60_ = extraout_var;
    auVar20 = auVar45._0_16_;
  }
  else {
    auVar20 = vsqrtss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
  }
  fVar23 = (ey->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar2 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar4 = (ey->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar43._0_4_ = (float)uVar2 * (float)uVar2;
  auVar43._4_4_ = (float)uVar4 * (float)uVar4;
  auVar43._8_8_ = 0;
  auVar16 = vmovshdup_avx(auVar43);
  fVar23 = fVar23 * fVar23 + auVar43._0_4_ + auVar16._0_4_;
  if (fVar23 < 0.0) {
    auVar46._0_4_ = sqrtf(fVar23);
    auVar46._4_60_ = extraout_var_00;
    auVar16 = auVar46._0_16_;
  }
  else {
    auVar16 = vsqrtss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
  }
  auVar16 = vinsertps_avx(auVar16,auVar20,0x10);
  fVar23 = (s->super_Tuple3<pbrt::Point3,_float>).x - (pRef->super_Tuple3<pbrt::Point3,_float>).x;
  fVar26 = (s->super_Tuple3<pbrt::Point3,_float>).y - (pRef->super_Tuple3<pbrt::Point3,_float>).y;
  fVar25 = (s->super_Tuple3<pbrt::Point3,_float>).z - (pRef->super_Tuple3<pbrt::Point3,_float>).z;
  auVar20 = vinsertps_avx(ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).x),
                          ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).x),0x10);
  auVar43 = vdivps_avx(auVar20,auVar16);
  auVar20 = vinsertps_avx(ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).y),
                          ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).y),0x10);
  auVar20 = vdivps_avx(auVar20,auVar16);
  auVar21 = vinsertps_avx(ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).z),
                          ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).z),0x10);
  auVar21 = vdivps_avx(auVar21,auVar16);
  auVar18 = vmovshdup_avx(auVar21);
  fVar28 = auVar20._0_4_;
  auVar19 = vmovshdup_avx(auVar20);
  auVar72 = ZEXT416((uint)(fVar28 * auVar18._0_4_));
  auVar17 = vfmsub213ss_fma(auVar21,auVar19,auVar72);
  auVar33 = vfnmadd231ss_fma(auVar72,auVar18,auVar20);
  auVar72 = vmovshdup_avx(auVar43);
  auVar73 = ZEXT416((uint)(auVar72._0_4_ * auVar21._0_4_));
  auVar8 = vfmsub213ss_fma(auVar43,auVar18,auVar73);
  auVar30 = vfnmadd231ss_fma(auVar73,auVar72,auVar21);
  auVar73 = ZEXT416((uint)(auVar19._0_4_ * auVar43._0_4_));
  auVar15 = vfmsub213ss_fma(auVar20,auVar72,auVar73);
  auVar60 = vfnmadd231ss_fma(auVar73,auVar19,auVar43);
  auVar73._0_4_ = fVar28 * fVar26;
  auVar73._4_4_ = auVar20._4_4_ * fVar26;
  auVar73._8_4_ = auVar20._8_4_ * fVar26;
  auVar73._12_4_ = auVar20._12_4_ * fVar26;
  auVar20._4_4_ = fVar23;
  auVar20._0_4_ = fVar23;
  auVar20._8_4_ = fVar23;
  auVar20._12_4_ = fVar23;
  auVar20 = vfmadd213ps_fma(auVar20,auVar43,auVar73);
  auVar78._4_4_ = fVar25;
  auVar78._0_4_ = fVar25;
  auVar78._8_4_ = fVar25;
  auVar78._12_4_ = fVar25;
  auVar78 = vfmadd213ps_fma(auVar78,auVar21,auVar20);
  auVar73 = vmovshdup_avx(auVar78);
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)((auVar8._0_4_ + auVar30._0_4_) * fVar26)),
                            ZEXT416((uint)fVar23),ZEXT416((uint)(auVar17._0_4_ + auVar33._0_4_)));
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar25),
                            ZEXT416((uint)(auVar15._0_4_ + auVar60._0_4_)));
  auVar17._0_8_ = auVar20._0_8_ ^ 0x8000000080000000;
  auVar17._8_4_ = auVar20._8_4_ ^ 0x80000000;
  auVar17._12_4_ = auVar20._12_4_ ^ 0x80000000;
  auVar17 = vminss_avx(auVar17,auVar20);
  auVar60._0_4_ = auVar17._0_4_;
  auVar76._4_4_ = auVar60._0_4_;
  auVar76._0_4_ = auVar60._0_4_;
  auVar76._8_4_ = auVar60._0_4_;
  auVar76._12_4_ = auVar60._0_4_;
  local_1c8._0_4_ = auVar78._0_4_;
  auVar74._0_4_ = (float)local_1c8._0_4_ * auVar60._0_4_;
  local_1c8._4_4_ = auVar78._4_4_;
  auVar74._4_4_ = (float)local_1c8._4_4_ * auVar60._0_4_;
  fStack_1c0 = auVar78._8_4_;
  auVar74._8_4_ = fStack_1c0 * auVar60._0_4_;
  fStack_1bc = auVar78._12_4_;
  auVar74._12_4_ = fStack_1bc * auVar60._0_4_;
  auVar60._4_12_ = auVar78._4_12_;
  auVar30._0_4_ = auVar16._0_4_ + (float)local_1c8._0_4_;
  auVar30._4_4_ = auVar16._4_4_ + (float)local_1c8._4_4_;
  auVar30._8_4_ = auVar16._8_4_ + fStack_1c0;
  auVar30._12_4_ = auVar16._12_4_ + fStack_1bc;
  auVar8 = vmovshdup_avx(auVar30);
  auVar20 = vblendps_avx(auVar78,auVar30,2);
  auVar15 = vfmsub213ps_fma(auVar76,auVar20,auVar74);
  auVar16 = vblendps_avx(auVar78,auVar76,2);
  auVar33 = vfnmadd213ps_fma(auVar16,auVar60,auVar74);
  local_158._0_4_ = auVar15._0_4_ + auVar33._0_4_;
  local_158._4_4_ = auVar15._4_4_ + auVar33._4_4_;
  fStack_150 = auVar15._8_4_ + auVar33._8_4_;
  fStack_14c = auVar15._12_4_ + auVar33._12_4_;
  fVar25 = auVar8._0_4_;
  fVar26 = (float)local_1c8._0_4_ * fVar25;
  auVar16 = vfmsub213ss_fma(auVar78,auVar73,ZEXT416((uint)fVar26));
  auVar15 = vfnmadd213ss_fma(auVar8,auVar78,ZEXT416((uint)fVar26));
  fVar23 = auVar16._0_4_ + auVar15._0_4_;
  auVar14._0_4_ = (float)local_158._0_4_ * (float)local_158._0_4_;
  auVar14._4_4_ = (float)local_158._4_4_ * (float)local_158._4_4_;
  auVar14._8_4_ = fStack_150 * fStack_150;
  auVar14._12_4_ = fStack_14c * fStack_14c;
  auVar16 = vhaddps_avx(auVar14,auVar14);
  auVar80._0_4_ = -fVar26;
  auVar80._4_4_ = 0x80000000;
  auVar80._8_4_ = 0x80000000;
  auVar80._12_4_ = 0x80000000;
  fVar26 = fVar23 * fVar23 + auVar16._0_4_;
  if (fVar26 < 0.0) {
    fVar26 = sqrtf(fVar26);
  }
  else {
    auVar16 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
    fVar26 = auVar16._0_4_;
  }
  auVar31._0_4_ = auVar30._0_4_ * auVar60._0_4_;
  auVar31._4_4_ = auVar30._4_4_ * auVar60._0_4_;
  auVar31._8_4_ = auVar30._8_4_ * auVar60._0_4_;
  auVar31._12_4_ = auVar30._12_4_ * auVar60._0_4_;
  auVar9._8_4_ = 0x80000000;
  auVar9._0_8_ = 0x8000000080000000;
  auVar9._12_4_ = 0x80000000;
  auVar14 = vxorps_avx512vl(auVar31,auVar9);
  auVar16 = vfmsub213ps_fma(auVar20,auVar76,auVar31);
  auVar61._4_12_ = auVar30._4_12_;
  auVar61._0_4_ = auVar60._0_4_;
  auVar20 = vinsertps_avx(auVar30,auVar17,0x10);
  auVar17 = vfnmadd213ps_fma(auVar20,auVar61,auVar31);
  local_1b8._0_4_ = auVar16._0_4_ + auVar17._0_4_;
  local_1b8._4_4_ = auVar16._4_4_ + auVar17._4_4_;
  fStack_1b0 = auVar16._8_4_ + auVar17._8_4_;
  fStack_1ac = auVar16._12_4_ + auVar17._12_4_;
  auVar32._0_4_ = (float)local_1b8._0_4_ * (float)local_1b8._0_4_;
  auVar32._4_4_ = (float)local_1b8._4_4_ * (float)local_1b8._4_4_;
  auVar32._8_4_ = fStack_1b0 * fStack_1b0;
  auVar32._12_4_ = fStack_1ac * fStack_1ac;
  auVar20 = vhaddps_avx(auVar32,auVar32);
  auVar16 = vfmadd231ss_fma(auVar80,auVar30,ZEXT416((uint)fVar25));
  fVar71 = auVar16._0_4_ + auVar15._0_4_;
  fVar27 = fVar71 * fVar71 + auVar20._0_4_;
  if (fVar27 < 0.0) {
    fVar27 = sqrtf(fVar27);
  }
  else {
    auVar20 = vsqrtss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27));
    fVar27 = auVar20._0_4_;
  }
  auVar75._4_4_ = fVar26;
  auVar75._0_4_ = fVar26;
  auVar75._8_4_ = fVar26;
  auVar75._12_4_ = fVar26;
  auVar15._8_4_ = 0x80000000;
  auVar15._0_8_ = 0x8000000080000000;
  auVar15._12_4_ = 0x80000000;
  auVar15 = vxorps_avx512vl(auVar74,auVar15);
  auVar81._4_4_ = fVar27;
  auVar81._0_4_ = fVar27;
  auVar81._8_4_ = fVar27;
  auVar81._12_4_ = fVar27;
  auVar20 = vblendps_avx(auVar30,auVar78,2);
  auVar16 = vfmadd231ps_fma(auVar14,auVar20,auVar76);
  local_128._0_4_ = auVar16._0_4_ + auVar17._0_4_;
  local_128._4_4_ = auVar16._4_4_ + auVar17._4_4_;
  fStack_120 = auVar16._8_4_ + auVar17._8_4_;
  fStack_11c = auVar16._12_4_ + auVar17._12_4_;
  fVar56 = auVar73._0_4_ * auVar30._0_4_;
  auVar10._8_4_ = 0x80000000;
  auVar10._0_8_ = 0x8000000080000000;
  auVar10._12_4_ = 0x80000000;
  auVar14 = vxorps_avx512vl(ZEXT416((uint)fVar56),auVar10);
  auVar17 = vfmsub132ss_fma(auVar30,ZEXT416((uint)fVar56),ZEXT416((uint)fVar25));
  auVar78 = vfnmadd231ss_fma(ZEXT416((uint)fVar56),auVar30,auVar73);
  auVar62._0_4_ = (float)local_128._0_4_ * (float)local_128._0_4_;
  auVar62._4_4_ = (float)local_128._4_4_ * (float)local_128._4_4_;
  auVar62._8_4_ = fStack_120 * fStack_120;
  auVar62._12_4_ = fStack_11c * fStack_11c;
  auVar16 = vhaddps_avx(auVar62,auVar62);
  fVar25 = auVar78._0_4_ + auVar17._0_4_;
  fVar56 = fVar25 * fVar25 + auVar16._0_4_;
  if (fVar56 < 0.0) {
    fVar56 = sqrtf(fVar56);
  }
  else {
    auVar16 = vsqrtss_avx(ZEXT416((uint)fVar56),ZEXT416((uint)fVar56));
    fVar56 = auVar16._0_4_;
  }
  auVar16 = vdivps_avx(_local_158,auVar75);
  fVar23 = fVar23 / fVar26;
  auVar17 = vdivps_avx(_local_1b8,auVar81);
  fVar71 = fVar71 / fVar27;
  auVar79._4_4_ = fVar56;
  auVar79._0_4_ = fVar56;
  auVar79._8_4_ = fVar56;
  auVar79._12_4_ = fVar56;
  auVar20 = vfmadd213ps_fma(auVar76,auVar20,auVar15);
  fVar24 = auVar20._0_4_ + auVar33._0_4_;
  fVar55 = auVar20._4_4_ + auVar33._4_4_;
  fVar57 = auVar20._8_4_ + auVar33._8_4_;
  fVar58 = auVar20._12_4_ + auVar33._12_4_;
  auVar33._0_4_ = fVar24 * fVar24;
  auVar33._4_4_ = fVar55 * fVar55;
  auVar33._8_4_ = fVar57 * fVar57;
  auVar33._12_4_ = fVar58 * fVar58;
  auVar20 = vhaddps_avx(auVar33,auVar33);
  auVar15 = vfmadd231ss_fma(auVar14,auVar73,ZEXT416((uint)local_1c8._0_4_));
  fVar26 = auVar15._0_4_ + auVar78._0_4_;
  fVar27 = fVar26 * fVar26 + auVar20._0_4_;
  if (fVar27 < 0.0) {
    local_168._4_4_ = sqrtf(fVar27);
  }
  else {
    auVar20 = vsqrtss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27));
    local_168._4_4_ = auVar20._0_4_;
  }
  auVar20 = vdivps_avx(_local_128,auVar79);
  auVar34._0_4_ = fVar25 / fVar56;
  auVar34._4_12_ = SUB6012((undefined1  [60])0x0,0);
  local_168._0_4_ = local_168._4_4_;
  fStack_160 = (float)local_168._4_4_;
  fStack_15c = (float)local_168._4_4_;
  auVar78 = vmovshdup_avx(auVar16);
  auVar15 = vmovshdup_avx(auVar17);
  auVar33 = vfnmsub231ss_fma(ZEXT416((uint)(auVar15._0_4_ * auVar78._0_4_)),auVar16,auVar17);
  auVar33 = vfnmadd231ss_fma(auVar33,ZEXT416((uint)fVar23),ZEXT416((uint)fVar71));
  if (0.0 <= auVar33._0_4_) {
    fVar25 = auVar17._0_4_ + auVar16._0_4_;
    fVar27 = auVar17._4_4_ + auVar16._4_4_;
    fVar56 = auVar17._8_4_ + auVar16._8_4_;
    fVar59 = auVar17._12_4_ + auVar16._12_4_;
    auVar36._0_4_ = fVar25 * fVar25;
    auVar36._4_4_ = fVar27 * fVar27;
    auVar36._8_4_ = fVar56 * fVar56;
    auVar36._12_4_ = fVar59 * fVar59;
    auVar33 = vhaddps_avx(auVar36,auVar36);
    fVar25 = (fVar71 + fVar23) * (fVar71 + fVar23) + auVar33._0_4_;
    if (fVar25 < 0.0) {
      fVar25 = sqrtf(fVar25);
    }
    else {
      auVar33 = vsqrtss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
      fVar25 = auVar33._0_4_;
    }
    auVar33 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar25 * 0.5)));
    uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar25 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar7 = (bool)((byte)uVar5 & 1);
    fVar25 = asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar33._0_4_));
    fVar25 = fVar25 + fVar25;
  }
  else {
    auVar33 = vsubps_avx(auVar17,auVar16);
    auVar35._0_4_ = auVar33._0_4_ * auVar33._0_4_;
    auVar35._4_4_ = auVar33._4_4_ * auVar33._4_4_;
    auVar35._8_4_ = auVar33._8_4_ * auVar33._8_4_;
    auVar35._12_4_ = auVar33._12_4_ * auVar33._12_4_;
    auVar33 = vhaddps_avx(auVar35,auVar35);
    fVar25 = (fVar71 - fVar23) * (fVar71 - fVar23) + auVar33._0_4_;
    if (fVar25 < 0.0) {
      fVar25 = sqrtf(fVar25);
    }
    else {
      auVar33 = vsqrtss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
      fVar25 = auVar33._0_4_;
    }
    auVar33 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar25 * 0.5)));
    uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar25 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar7 = (bool)((byte)uVar5 & 1);
    auVar47._0_4_ = asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar33._0_4_));
    auVar47._4_60_ = extraout_var_01;
    auVar33 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar47._0_16_,ZEXT416(0x40490fdb));
    fVar25 = auVar33._0_4_;
  }
  auVar12._4_4_ = fVar55;
  auVar12._0_4_ = fVar24;
  auVar12._8_4_ = fVar57;
  auVar12._12_4_ = fVar58;
  auVar33 = vdivps_avx(auVar12,_local_168);
  fVar26 = fVar26 / (float)local_168._4_4_;
  auVar14 = vmovshdup_avx(auVar20);
  fVar56 = auVar14._0_4_;
  auVar15 = vfnmsub231ss_fma(ZEXT416((uint)(fVar56 * auVar15._0_4_)),auVar20,auVar17);
  auVar15 = vfnmadd231ss_fma(auVar15,ZEXT416((uint)fVar71),auVar34);
  fVar27 = auVar20._0_4_;
  if (0.0 <= auVar15._0_4_) {
    fVar24 = fVar27 + auVar17._0_4_;
    fVar55 = auVar20._4_4_ + auVar17._4_4_;
    fVar57 = auVar20._8_4_ + auVar17._8_4_;
    fVar58 = auVar20._12_4_ + auVar17._12_4_;
    auVar38._0_4_ = fVar24 * fVar24;
    auVar38._4_4_ = fVar55 * fVar55;
    auVar38._8_4_ = fVar57 * fVar57;
    auVar38._12_4_ = fVar58 * fVar58;
    auVar17 = vhaddps_avx(auVar38,auVar38);
    fVar71 = (auVar34._0_4_ + fVar71) * (auVar34._0_4_ + fVar71) + auVar17._0_4_;
    if (fVar71 < 0.0) {
      fVar71 = sqrtf(fVar71);
    }
    else {
      auVar17 = vsqrtss_avx(ZEXT416((uint)fVar71),ZEXT416((uint)fVar71));
      fVar71 = auVar17._0_4_;
    }
    auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar71 * 0.5)));
    uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar71 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar7 = (bool)((byte)uVar5 & 1);
    fVar71 = asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar17._0_4_));
    fVar71 = fVar71 + fVar71;
  }
  else {
    auVar17 = vsubps_avx(auVar20,auVar17);
    auVar37._0_4_ = auVar17._0_4_ * auVar17._0_4_;
    auVar37._4_4_ = auVar17._4_4_ * auVar17._4_4_;
    auVar37._8_4_ = auVar17._8_4_ * auVar17._8_4_;
    auVar37._12_4_ = auVar17._12_4_ * auVar17._12_4_;
    auVar17 = vhaddps_avx(auVar37,auVar37);
    fVar71 = (auVar34._0_4_ - fVar71) * (auVar34._0_4_ - fVar71) + auVar17._0_4_;
    if (fVar71 < 0.0) {
      fVar71 = sqrtf(fVar71);
    }
    else {
      auVar17 = vsqrtss_avx(ZEXT416((uint)fVar71),ZEXT416((uint)fVar71));
      fVar71 = auVar17._0_4_;
    }
    auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar71 * 0.5)));
    uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar71 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar7 = (bool)((byte)uVar5 & 1);
    auVar48._0_4_ = asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar17._0_4_));
    auVar48._4_60_ = extraout_var_02;
    auVar17 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar48._0_16_,ZEXT416(0x40490fdb));
    fVar71 = auVar17._0_4_;
  }
  auVar17 = vmovshdup_avx(auVar33);
  fVar55 = auVar17._0_4_;
  auVar20 = vfnmsub231ss_fma(ZEXT416((uint)(fVar55 * fVar56)),auVar33,auVar20);
  auVar20 = vfnmadd231ss_fma(auVar20,auVar34,ZEXT416((uint)fVar26));
  fVar24 = auVar33._0_4_;
  if (0.0 <= auVar20._0_4_) {
    fVar27 = (fVar26 + auVar34._0_4_) * (fVar26 + auVar34._0_4_) +
             (fVar24 + fVar27) * (fVar24 + fVar27) + (fVar55 + fVar56) * (fVar55 + fVar56);
    if (fVar27 < 0.0) {
      fVar27 = sqrtf(fVar27);
    }
    else {
      auVar20 = vsqrtss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27));
      fVar27 = auVar20._0_4_;
    }
    auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar27 * 0.5)));
    uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar27 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar7 = (bool)((byte)uVar5 & 1);
    fVar27 = asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar20._0_4_));
    fVar27 = fVar27 + fVar27;
  }
  else {
    fVar27 = (fVar26 - auVar34._0_4_) * (fVar26 - auVar34._0_4_) +
             (fVar24 - fVar27) * (fVar24 - fVar27) + (fVar55 - fVar56) * (fVar55 - fVar56);
    if (fVar27 < 0.0) {
      fVar27 = sqrtf(fVar27);
    }
    else {
      auVar20 = vsqrtss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27));
      fVar27 = auVar20._0_4_;
    }
    auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar27 * 0.5)));
    uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar27 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar7 = (bool)((byte)uVar5 & 1);
    auVar49._0_4_ = asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar20._0_4_));
    auVar49._4_60_ = extraout_var_03;
    auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar49._0_16_,ZEXT416(0x40490fdb));
    fVar27 = auVar20._0_4_;
  }
  auVar20 = vfnmsub231ss_fma(ZEXT416((uint)(fVar55 * auVar78._0_4_)),auVar33,auVar16);
  auVar20 = vfnmadd231ss_fma(auVar20,ZEXT416((uint)fVar26),ZEXT416((uint)fVar23));
  if (0.0 <= auVar20._0_4_) {
    fVar24 = auVar16._0_4_ + fVar24;
    fVar56 = auVar16._4_4_ + auVar33._4_4_;
    fVar55 = auVar16._8_4_ + auVar33._8_4_;
    fVar57 = auVar16._12_4_ + auVar33._12_4_;
    auVar40._0_4_ = fVar24 * fVar24;
    auVar40._4_4_ = fVar56 * fVar56;
    auVar40._8_4_ = fVar55 * fVar55;
    auVar40._12_4_ = fVar57 * fVar57;
    auVar20 = vhaddps_avx(auVar40,auVar40);
    fVar26 = (fVar23 + fVar26) * (fVar23 + fVar26) + auVar20._0_4_;
    if (fVar26 < 0.0) {
      fVar26 = sqrtf(fVar26);
    }
    else {
      auVar20 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
      fVar26 = auVar20._0_4_;
    }
    auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar26 * 0.5)));
    uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar26 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar7 = (bool)((byte)uVar5 & 1);
    fVar26 = asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar20._0_4_));
    fVar26 = fVar26 + fVar26;
  }
  else {
    auVar20 = vsubps_avx(auVar16,auVar33);
    auVar39._0_4_ = auVar20._0_4_ * auVar20._0_4_;
    auVar39._4_4_ = auVar20._4_4_ * auVar20._4_4_;
    auVar39._8_4_ = auVar20._8_4_ * auVar20._8_4_;
    auVar39._12_4_ = auVar20._12_4_ * auVar20._12_4_;
    auVar20 = vhaddps_avx(auVar39,auVar39);
    fVar26 = (fVar23 - fVar26) * (fVar23 - fVar26) + auVar20._0_4_;
    if (fVar26 < 0.0) {
      fVar26 = sqrtf(fVar26);
    }
    else {
      auVar20 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
      fVar26 = auVar20._0_4_;
    }
    auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar26 * 0.5)));
    uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar26 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar7 = (bool)((byte)uVar5 & 1);
    auVar50._0_4_ = asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar20._0_4_));
    auVar50._4_60_ = extraout_var_04;
    auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar50._0_16_,ZEXT416(0x40490fdb));
    fVar26 = auVar20._0_4_;
  }
  fVar25 = fVar25 + fVar71 + fVar27 + fVar26 + -6.2831855;
  if (0.001 <= fVar25) {
    fVar71 = (pRect->super_Tuple3<pbrt::Point3,_float>).x -
             (pRef->super_Tuple3<pbrt::Point3,_float>).x;
    fVar56 = (pRect->super_Tuple3<pbrt::Point3,_float>).y -
             (pRef->super_Tuple3<pbrt::Point3,_float>).y;
    fVar24 = (pRect->super_Tuple3<pbrt::Point3,_float>).z -
             (pRef->super_Tuple3<pbrt::Point3,_float>).z;
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar56 * auVar19._0_4_)),ZEXT416((uint)fVar71),
                              ZEXT416((uint)auVar72._0_4_));
    auVar16 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar24),ZEXT416((uint)auVar18._0_4_));
    auVar20 = vminss_avx(auVar8,auVar16);
    uVar5 = vcmpss_avx512f(auVar16,auVar73,1);
    bVar7 = (bool)((byte)uVar5 & 1);
    auVar18._4_12_ = auVar20._4_12_;
    auVar18._0_4_ = (uint)bVar7 * (int)auVar73._0_4_ + (uint)!bVar7 * auVar20._0_4_;
    uVar5 = vcmpss_avx512f(auVar18,ZEXT816(0) << 0x20,0);
    bVar7 = (bool)((byte)uVar5 & 1);
    fVar57 = (float)((uint)bVar7 * 0x2edbe6ff + (uint)!bVar7 * auVar18._0_4_);
    fVar55 = ((auVar60._0_4_ * auVar60._0_4_) / (fVar57 * fVar57) + 1.0) - fVar23 * fVar23;
    if (fVar55 < 0.0) {
      auVar51._0_4_ = sqrtf(fVar55);
      auVar51._4_60_ = extraout_var_05;
      auVar20 = auVar51._0_16_;
    }
    else {
      auVar20 = vsqrtss_avx(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
    }
    if (InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
        ::reg == '\0') {
      iVar13 = __cxa_guard_acquire(&InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                                    ::reg);
      if (iVar13 != 0) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)
                   &InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                    ::reg,InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::
                          Point3<float>const&,pbrt::Vector3<float>const&,pbrt::
                          Vector3<float>const&,pbrt::Point3<float>const&)::$_0::__invoke(pbrt::
                          StatsAccumulator__,(PixelAccumFunc)0x0);
        __cxa_guard_release(&InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                             ::reg);
      }
    }
    auVar19._8_4_ = 0x80000000;
    auVar19._0_8_ = 0x8000000080000000;
    auVar19._12_4_ = 0x80000000;
    auVar16 = vxorps_avx512vl(auVar34,auVar19);
    auVar72._8_4_ = 0x7fffffff;
    auVar72._0_8_ = 0x7fffffff7fffffff;
    auVar72._12_4_ = 0x7fffffff;
    auVar17 = vpternlogd_avx512vl(ZEXT416((uint)fVar57),auVar20,auVar72,0xd8);
    *(long *)(in_FS_OFFSET + -0xe0) = *(long *)(in_FS_OFFSET + -0xe0) + 1;
    fVar58 = auVar17._0_4_;
    if ((fVar58 == 0.0) && (!NAN(fVar58))) {
      *(long *)(in_FS_OFFSET + -0xe8) = *(long *)(in_FS_OFFSET + -0xe8) + 1;
    }
    auVar19 = vfmsub213ss_fma(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23),
                              ZEXT416((uint)(auVar34._0_4_ * auVar34._0_4_)));
    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ * auVar34._0_4_)),auVar16,auVar34);
    auVar18 = vmaxss_avx(ZEXT416((uint)(auVar19._0_4_ + auVar18._0_4_ + fVar55)),
                         (undefined1  [16])0x0);
    if (auVar18._0_4_ < 0.0) {
      fVar55 = sqrtf(auVar18._0_4_);
    }
    else {
      auVar18 = vsqrtss_avx(auVar18,auVar18);
      fVar55 = auVar18._0_4_;
    }
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar18 = vxorps_avx512vl(auVar17,auVar8);
    auVar70._8_4_ = 0x7fffffff;
    auVar70._0_8_ = 0x7fffffff7fffffff;
    auVar70._12_4_ = 0x7fffffff;
    auVar19 = vpternlogd_avx512vl(ZEXT416((uint)(fVar23 * auVar18._0_4_)),auVar70,
                                  ZEXT416((uint)(fVar23 * fVar55)),0xb8);
    auVar16 = vfmadd213ss_fma(auVar16,auVar17,auVar19);
    auVar20 = vpand_avx(auVar70,auVar20);
    auVar20 = vfmsub213ss_fma(auVar34,ZEXT416((uint)fVar23),ZEXT416((uint)(auVar20._0_4_ * fVar55)))
    ;
    auVar52._0_4_ = atan2f(auVar16._0_4_,auVar20._0_4_);
    auVar52._4_60_ = extraout_var_06;
    fVar23 = fVar57 * fVar57 + auVar60._0_4_ * auVar60._0_4_;
    if (fVar23 < 0.0) {
      fVar55 = sqrtf(fVar23);
    }
    else {
      auVar20 = vsqrtss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
      fVar55 = auVar20._0_4_;
    }
    uVar5 = vcmpss_avx512f(ZEXT816(0) << 0x40,auVar52._0_16_,1);
    auVar20 = vfmadd132ss_fma(auVar43,ZEXT416((uint)(fVar56 * fVar28)),ZEXT416((uint)fVar71));
    fVar28 = fVar23 + (float)local_1c8._0_4_ * (float)local_1c8._0_4_;
    if (fVar28 < 0.0) {
      fVar28 = sqrtf(fVar28);
    }
    else {
      auVar16 = vsqrtss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
      fVar28 = auVar16._0_4_;
    }
    uVar6 = vcmpss_avx512f(auVar18,ZEXT416((uint)fVar58),0);
    auVar20 = vfmadd132ss_fma(auVar21,auVar20,ZEXT416((uint)fVar24));
    local_1c8._0_4_ = (float)local_1c8._0_4_ / fVar28;
    fVar28 = auVar30._0_4_ * auVar30._0_4_ + fVar23;
    if (fVar28 < 0.0) {
      fVar28 = sqrtf(fVar28);
    }
    else {
      auVar16 = vsqrtss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
      fVar28 = auVar16._0_4_;
    }
    auVar77._0_4_ = auVar30._0_4_ / fVar28;
    auVar77._4_12_ = auVar30._4_12_;
    local_c8 = auVar20._0_4_;
    auVar20 = vfmsub213ss_fma(_local_1c8,_local_1c8,
                              ZEXT416((uint)((float)local_1c8._0_4_ * auVar77._0_4_)));
    auVar16 = vfnmadd231ss_fma(ZEXT416((uint)((float)local_1c8._0_4_ * auVar77._0_4_)),_local_1c8,
                               auVar77);
    fVar28 = auVar20._0_4_ + auVar16._0_4_;
    fVar56 = (float)local_1c8._0_4_ - auVar77._0_4_;
    auVar21._8_4_ = 0x7fffffff;
    auVar21._0_8_ = 0x7fffffff7fffffff;
    auVar21._12_4_ = 0x7fffffff;
    auVar20 = vandps_avx512vl(ZEXT416((uint)fVar56),auVar21);
    fVar23 = local_c8 * local_c8 + fVar23;
    fVar71 = local_c8 * local_c8 * fVar23;
    if (fVar71 < 0.0) {
      fVar24 = sqrtf(fVar71);
    }
    else {
      auVar16 = vsqrtss_avx(ZEXT416((uint)fVar71),ZEXT416((uint)fVar71));
      fVar24 = auVar16._0_4_;
    }
    fVar56 = fVar56 * fVar56;
    if (fVar71 < 0.0) {
      fVar71 = sqrtf(fVar71);
    }
    else {
      auVar16 = vsqrtss_avx(ZEXT416((uint)fVar71),ZEXT416((uint)fVar71));
      fVar71 = auVar16._0_4_;
    }
    auVar20 = vinsertps_avx(ZEXT416((uint)(fVar28 - (fVar24 * auVar20._0_4_) / fVar23)),
                            ZEXT416((uint)(fVar28 + (fVar71 * auVar20._0_4_) / fVar23)),0x10);
    auVar63._4_4_ = fVar56;
    auVar63._0_4_ = fVar56;
    auVar63._8_4_ = fVar56;
    auVar63._12_4_ = fVar56;
    auVar66._8_4_ = 0x3f800000;
    auVar66._0_8_ = 0x3f8000003f800000;
    auVar66._12_4_ = 0x3f800000;
    auVar20 = vdivps_avx(auVar20,auVar63);
    auVar16 = vsubps_avx(auVar66,auVar20);
    auVar64._0_4_ = auVar77._0_4_ * auVar20._0_4_;
    auVar64._4_4_ = auVar77._0_4_ * auVar20._4_4_;
    auVar64._8_4_ = auVar77._0_4_ * auVar20._8_4_;
    auVar64._12_4_ = auVar77._0_4_ * auVar20._12_4_;
    auVar67._4_4_ = local_1c8._0_4_;
    auVar67._0_4_ = local_1c8._0_4_;
    auVar67._8_4_ = local_1c8._0_4_;
    auVar67._12_4_ = local_1c8._0_4_;
    auVar16 = vfmadd213ps_fma(auVar67,auVar16,auVar64);
    fVar23 = auVar16._0_4_;
    auVar42._0_4_ = fVar23 * fVar23;
    fVar28 = auVar16._4_4_;
    auVar42._4_4_ = fVar28 * fVar28;
    fVar71 = auVar16._8_4_;
    auVar42._8_4_ = fVar71 * fVar71;
    fVar56 = auVar16._12_4_;
    auVar42._12_4_ = fVar56 * fVar56;
    auVar16 = vmovshdup_avx(auVar42);
    fVar24 = 1.0 - auVar42._0_4_;
    if (fVar24 < 0.0) {
      auVar53._0_4_ = sqrtf(fVar24);
      auVar53._4_60_ = extraout_var_07;
      auVar43 = auVar53._0_16_;
    }
    else {
      auVar43 = vsqrtss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
    }
    auVar68._0_4_ = fVar55 * fVar23;
    auVar68._4_4_ = fVar55 * fVar28;
    auVar68._8_4_ = fVar55 * fVar71;
    auVar68._12_4_ = fVar55 * fVar56;
    fVar23 = 1.0 - auVar16._0_4_;
    if (fVar23 < 0.0) {
      auVar54._0_4_ = sqrtf(fVar23);
      auVar54._4_60_ = extraout_var_08;
      auVar16 = auVar54._0_16_;
    }
    else {
      auVar16 = vsqrtss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
    }
    auVar17 = ZEXT416((uint)((fVar26 + (float)((uint)((byte)uVar6 & 1) * 0x40490fdb +
                                              (uint)!(bool)((byte)uVar6 & 1) *
                                              ((uint)((byte)uVar5 & 1) *
                                               (int)(auVar52._0_4_ + -6.2831855) +
                                              (uint)!(bool)((byte)uVar5 & 1) * (int)auVar52._0_4_))
                                       + fVar27) / fVar25));
    auVar16 = vinsertps_avx(auVar43,auVar16,0x10);
    auVar16 = vdivps_avx(auVar68,auVar16);
    auVar65._4_4_ = local_c8;
    auVar65._0_4_ = local_c8;
    auVar65._8_4_ = local_c8;
    auVar65._12_4_ = local_c8;
    auVar16 = vsubps_avx(auVar16,auVar65);
    auVar11._8_4_ = 0x7fffffff;
    auVar11._0_8_ = 0x7fffffff7fffffff;
    auVar11._12_4_ = 0x7fffffff;
    auVar21 = vandps_avx512vl(auVar16,auVar11);
    auVar43 = vshufps_avx(auVar21,auVar21,0xf5);
    auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar17);
    uVar5 = vcmpss_avx512f(auVar17,ZEXT816(0) << 0x40,1);
    iVar13 = (uint)!(bool)((byte)uVar5 & 1) * auVar16._0_4_;
    auVar22._4_12_ = auVar16._4_12_;
    auVar22._0_4_ = iVar13;
    if (auVar43._0_4_ <= auVar21._0_4_) {
      auVar44._4_12_ = auVar20._4_12_;
      auVar44._0_4_ = iVar13;
      TVar29 = auVar44._0_8_;
    }
    else {
      auVar20 = vinsertps_avx(auVar22,ZEXT416((uint)auVar20._0_4_),0x1c);
      TVar29 = auVar20._0_8_;
    }
  }
  else {
    fVar28 = (pRect->super_Tuple3<pbrt::Point3,_float>).y - (s->super_Tuple3<pbrt::Point3,_float>).y
    ;
    fVar23 = (ex->super_Tuple3<pbrt::Vector3,_float>).x;
    fVar26 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
    auVar16 = ZEXT416((uint)((pRect->super_Tuple3<pbrt::Point3,_float>).x -
                            (s->super_Tuple3<pbrt::Point3,_float>).x));
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar26)),auVar16,ZEXT416((uint)fVar23));
    fVar25 = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar43 = ZEXT416((uint)((pRect->super_Tuple3<pbrt::Point3,_float>).z -
                            (s->super_Tuple3<pbrt::Point3,_float>).z));
    auVar20 = vfmadd231ss_fma(auVar20,auVar43,ZEXT416((uint)fVar25));
    auVar69._0_4_ = auVar20._0_4_ / (fVar23 * fVar23 + fVar26 * fVar26 + fVar25 * fVar25);
    auVar69._4_12_ = auVar20._4_12_;
    fVar23 = (ey->super_Tuple3<pbrt::Vector3,_float>).x;
    fVar26 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar26)),ZEXT416((uint)fVar23),auVar16);
    fVar25 = (ey->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar25),auVar43);
    auVar41._0_4_ = auVar20._0_4_ / (fVar23 * fVar23 + fVar26 * fVar26 + fVar25 * fVar25);
    auVar41._4_12_ = auVar20._4_12_;
    auVar20 = vinsertps_avx(auVar69,auVar41,0x10);
    TVar29 = auVar20._0_8_;
  }
  return (Point2f)TVar29;
}

Assistant:

Point2f InvertSphericalRectangleSample(const Point3f &pRef, const Point3f &s,
                                       const Vector3f &ex, const Vector3f &ey,
                                       const Point3f &pRect) {
    // TODO: Delete anything unused in the below...

    // SphQuadInit()
    // local reference system 'R'
    Float exl = Length(ex), eyl = Length(ey);
    Frame R = Frame::FromXY(ex / exl, ey / eyl);

    // compute rectangle coords in local reference system
    Vector3f d = s - pRef;
    Vector3f dLocal = R.ToLocal(d);
    Float z0 = dLocal.z;

    // flip 'z' to make it point against 'Q'
    if (z0 > 0) {
        R.z = -R.z;
        z0 *= -1;
    }
    Float z0sq = Sqr(z0);
    Float x0 = dLocal.x;
    Float y0 = dLocal.y;
    Float x1 = x0 + exl;
    Float y1 = y0 + eyl;
    Float y0sq = Sqr(y0), y1sq = Sqr(y1);

    // create vectors to four vertices
    Vector3f v00(x0, y0, z0), v01(x0, y1, z0);
    Vector3f v10(x1, y0, z0), v11(x1, y1, z0);

    // compute normals to edges
    Vector3f n0 = Normalize(Cross(v00, v10));
    Vector3f n1 = Normalize(Cross(v10, v11));
    Vector3f n2 = Normalize(Cross(v11, v01));
    Vector3f n3 = Normalize(Cross(v01, v00));

    // compute internal angles (gamma_i)
    Float g0 = AngleBetween(-n0, n1);
    Float g1 = AngleBetween(-n1, n2);
    Float g2 = AngleBetween(-n2, n3);
    Float g3 = AngleBetween(-n3, n0);

    // compute predefined constants
    Float b0 = n0.z, b1 = n2.z, b0sq = Sqr(b0), b1sq = Sqr(b1);

    // compute solid angle from internal angles
    Float solidAngle = double(g0) + double(g1) + double(g2) + double(g3) - 2. * Pi;

    // TODO: this (rarely) goes differently than sample. figure out why...
    if (solidAngle < 1e-3) {
        Vector3f pq = pRect - s;
        return Point2f(Dot(pq, ex) / LengthSquared(ex), Dot(pq, ey) / LengthSquared(ey));
    }

    Vector3f v = R.ToLocal(pRect - pRef);
    Float xu = v.x, yv = v.y;

    xu = Clamp(xu, x0, x1);  // avoid Infs
    if (xu == 0)
        xu = 1e-10;

    // DOing all this in double actually makes things slightly worse???!?
    // Float fusq = (1 - b0sq * Sqr(cu)) / Sqr(cu);
    // Float fusq = 1 / Sqr(cu) - b0sq;  // more stable
    Float invcusq = 1 + z0sq / Sqr(xu);
    Float fusq = invcusq - b0sq;  // the winner so far
    Float fu = std::copysign(std::sqrt(fusq), xu);
    // Note, though have 1 + z^2/x^2 - b0^2, which isn't great if b0 \approx 1
    // double fusq = 1. - Sqr(double(b0)) + Sqr(double(z0) / double(xu));  //
    // this is worse?? double fu = std::copysign(std::sqrt(fusq), cu);
    CHECK_RARE(1e-6, fu == 0);

    // State of the floating point world: in the bad cases, about half the
    // error seems to come from inaccuracy in fu and half comes from
    // inaccuracy in sqrt/au.
    //
    // For fu, the main issue comes adding a small value to 1+ in invcusq
    // and then having b0sq be close to one, so having catastrophic
    // cancellation affect fusq. Approximating it as z0sq / Sqr(xu) when
    // b0sq is close to one doesn't help, however..
    //
    // For au, DifferenceOfProducts doesn't seem to help with the two
    // factors. Furthermore, while it would be nice to think about this
    // like atan(y/x) and then rewrite/simplify y/x, we need to do so in a
    // way that doesn't flip the sign of x and y, which would be fine if we
    // were computing y/x, but messes up atan2's quadrant-determinations...

    Float sqrt = SafeSqrt(DifferenceOfProducts(b0, b0, b1, b1) + fusq);
    // No benefit to difference of products here...
    Float au = std::atan2(-(b1 * fu) - std::copysign(b0 * sqrt, fu * b0),
                          b0 * b1 - sqrt * std::abs(fu));
    if (au > 0)
        au -= 2 * Pi;

    if (fu == 0)
        au = Pi;
    Float u0 = (au + g2 + g3) / solidAngle;

    Float ddsq = Sqr(xu) + z0sq;
    Float dd = std::sqrt(ddsq);
    Float h0 = y0 / std::sqrt(ddsq + y0sq);
    Float h1 = y1 / std::sqrt(ddsq + y1sq);
    Float yvsq = Sqr(yv);

    Float u1[2] = {(DifferenceOfProducts(h0, h0, h0, h1) -
                    std::abs(h0 - h1) * std::sqrt(yvsq * (ddsq + yvsq)) / (ddsq + yvsq)) /
                       Sqr(h0 - h1),
                   (DifferenceOfProducts(h0, h0, h0, h1) +
                    std::abs(h0 - h1) * std::sqrt(yvsq * (ddsq + yvsq)) / (ddsq + yvsq)) /
                       Sqr(h0 - h1)};

    // TODO: yuck is there a better way to figure out which is the right
    // solution?
    Float hv[2] = {Lerp(u1[0], h0, h1), Lerp(u1[1], h0, h1)};
    Float hvsq[2] = {Sqr(hv[0]), Sqr(hv[1])};
    Float yz[2] = {(hv[0] * dd) / std::sqrt(1 - hvsq[0]),
                   (hv[1] * dd) / std::sqrt(1 - hvsq[1])};

    Point2f u = (std::abs(yz[0] - yv) < std::abs(yz[1] - yv))
                    ? Point2f(Clamp(u0, 0, 1), u1[0])
                    : Point2f(Clamp(u0, 0, 1), u1[1]);

    return u;
}